

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

ScriptFunction *
Js::GlobalObject::DefaultEvalHelper
          (ScriptContext *scriptContext,char16 *source,int sourceLength,ModuleID moduleID,
          uint32 grfscr,LPCOLESTR pszTitle,BOOL registerDocument,BOOL isIndirect,BOOL strictMode)

{
  undefined1 *puVar1;
  ThreadContext *pTVar2;
  SourceContextInfo *this;
  JavascriptLibrary *this_00;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  ULONG UVar6;
  uint sourceIndex;
  HRESULT HVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  uchar *dest;
  size_t numBytes;
  SRCINFO *srcInfo;
  undefined4 extraout_var;
  FunctionBody *pFVar10;
  GeneratorVirtualScriptFunction *pGVar11;
  undefined8 uVar12;
  ParseableFunctionInfo *pPVar13;
  ulong count;
  uint uVar14;
  undefined1 local_c58 [8];
  Parser parser;
  ArenaAllocator tempArena;
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  CompileScriptException se;
  AutoDynamicCodeReference local_98;
  AutoDynamicCodeReference dynamicFunctionReference;
  ParseNodeProg *local_80;
  ParseNodeProg *parseTree;
  Utf8SourceInfo *sourceInfo;
  ParseableFunctionInfo *local_68;
  ParseableFunctionInfo *funcBody;
  undefined8 local_58;
  undefined4 local_4c;
  uint32 local_48;
  undefined4 local_44;
  AutoHandledExceptionType local_3e;
  bool local_3d;
  uint local_3c;
  AutoHandledExceptionType __autoHandledExceptionType;
  HRESULT HStack_38;
  
  dynamicFunctionReference.m_scriptContext = (ScriptContext *)source;
  sourceInfo._4_4_ = moduleID;
  local_48 = sourceLength;
  local_3c = grfscr;
  if (sourceLength < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x333,"(sourceLength >= 0)","sourceLength >= 0");
    if (!bVar4) goto LAB_00a245f2;
    *puVar9 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x334,"(scriptContext)","scriptContext");
    if (!bVar4) goto LAB_00a245f2;
    *puVar9 = 0;
  }
  bVar4 = ThreadContext::EvalDisabled(scriptContext->threadContext);
  if (bVar4) {
    uVar12 = __cxa_allocate_exception(1);
    __cxa_throw(uVar12,&EvalDisabledException::typeinfo,0);
  }
  ScriptContext::ProfileBegin(scriptContext,EvalCompilePhase);
  __leaveScriptObject.__exceptionCheck.handledExceptionType = ExceptionType_None;
  __leaveScriptObject._36_4_ = 0;
  local_68 = (ParseableFunctionInfo *)0x0;
  LeaveScriptObject<true,_false,_false>::LeaveScriptObject
            ((LeaveScriptObject<true,_false,_false> *)
             &tempArena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              freeList,scriptContext,&stack0xfffffffffffffff8);
  pTVar2 = scriptContext->threadContext;
  local_3d = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  funcBody = (ParseableFunctionInfo *)scriptContext;
  AutoHandledExceptionType::AutoHandledExceptionType
            (&local_3e,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  uVar5 = UInt32Math::MulAdd<3u,1u>(local_48);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             &parser.m_deferringAST,L"EvalHelperArena",
             &(scriptContext->threadContext->pageAllocator).super_PageAllocator,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  count = (ulong)uVar5;
  local_58 = 0;
  dest = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char,false>
                   ((Memory *)&parser.m_deferringAST,(ArenaAllocator *)Memory::ArenaAllocator::Alloc
                    ,0,count);
  if (0x7ffffffe < local_48) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x34f,"(cchSource < 0x7fffffff)","cchSource < MAXLONG");
    if (!bVar4) goto LAB_00a245f2;
    *puVar9 = 0;
  }
  numBytes = utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                       (dest,count,(char16 *)dynamicFunctionReference.m_scriptContext,local_48);
  if (count < numBytes + 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x351,"(cbSource + 1 <= cbUtf8Buffer)",
                                "cbSource + 1 <= cbUtf8Buffer");
    if (!bVar4) goto LAB_00a245f2;
    *puVar9 = 0;
  }
  srcInfo = ScriptContext::GetModuleSrcInfo(scriptContext,sourceInfo._4_4_);
  EnterPinnedScope(&parseTree);
  parseTree = (ParseNodeProg *)
              Utf8SourceInfo::New(scriptContext,dest,local_48,numBytes,srcInfo,
                                  (bool)((byte)(local_3c >> 0x11) & 1));
  Parser::Parser((Parser *)local_c58,scriptContext,strictMode,(PageAllocator *)0x0,false,0xaa8);
  local_80 = (ParseNodeProg *)0x0;
  this = (srcInfo->sourceContextInfo).ptr;
  local_58 = 0;
  HStack_38 = 0;
  bVar4 = SourceContextInfo::IsSourceProfileLoaded(this);
  HStack_38 = 0;
  UVar6 = Parser::GetDeferralThreshold(bVar4);
  uVar14 = local_3c;
  if (UVar6 < local_48) {
    HStack_38 = 0;
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01441eb0,DeferParsePhase);
    uVar14 = local_3c;
    if (!bVar4) {
      uVar14 = local_3c | 8;
    }
  }
  local_3c = uVar14 | 0x20;
  uVar14 = uVar14 & 0xfffffbff | 0x20;
  UVar6 = uVar14;
  if (isIndirect == 0) {
    UVar6 = local_3c;
  }
  HStack_38 = 0;
  HStack_38 = Parser::ParseCesu8Source
                        ((Parser *)local_c58,&local_80,dest,numBytes,UVar6,
                         (CompileScriptException *)&__leaveScriptObject.__exceptionCheck,
                         &this->nextLocalFunctionId,this);
  (parseTree->super_ParseNodeFnc).functionId = local_3c;
  if ((HStack_38 < 0) || (local_80 == (ParseNodeProg *)0x0)) {
    local_58 = 0;
  }
  else {
    local_98.m_scriptContext = scriptContext;
    JavascriptLibrary::BeginDynamicFunctionReferences
              ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    if (0x7ffffffe < local_48) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                  ,0x374,"(cchSource < 0x7fffffff)","cchSource < MAXLONG");
      if (!bVar4) goto LAB_00a245f2;
      *puVar9 = 0;
    }
    sourceIndex = ScriptContext::SaveSourceNoCopy
                            (scriptContext,(Utf8SourceInfo *)parseTree,local_48,true);
    if ((strictMode == 0 && isIndirect != 0) &&
       (((local_80->super_ParseNodeFnc).fncFlags & kFunctionStrictMode) == kFunctionNone)) {
      local_3c = uVar14;
    }
    HVar7 = GenerateByteCode(local_80,local_3c,scriptContext,&local_68,sourceIndex,false,
                             (Parser *)local_c58,
                             (CompileScriptException *)&__leaveScriptObject.__exceptionCheck,
                             (ScopeInfo *)0x0,(ScriptFunction **)0x0);
    local_58 = CONCAT44(extraout_var,HVar7);
    (parseTree->super_ParseNodeFnc).deferredParseNextFunctionId = local_3c;
    AutoDynamicCodeReference::~AutoDynamicCodeReference(&local_98);
  }
  LeavePinnedScope();
  Parser::~Parser((Parser *)local_c58);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             &parser.m_deferringAST);
  AutoHandledExceptionType::~AutoHandledExceptionType(&local_3e);
  pPVar13 = funcBody;
  local_4c = 0;
  local_44 = 0;
  ThreadContext::DisposeOnLeaveScript
            ((ThreadContext *)funcBody[5].super_FunctionProxy.m_utf8SourceInfo.ptr);
  pTVar2->reentrancySafeOrHandled = local_3d;
  LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_false,_false> *)
             &tempArena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              freeList);
  ScriptContext::ProfileEnd((ScriptContext *)pPVar13,EvalCompilePhase);
  if ((char)local_4c != '\0') {
    JavascriptError::ThrowOutOfMemoryError((ScriptContext *)funcBody);
  }
  if ((char)local_44 == '\x01') {
    uVar12 = __cxa_allocate_exception(1);
    __cxa_throw(uVar12,&NotImplementedException::typeinfo,0);
  }
  if (HStack_38 < 0) {
    JavascriptError::ThrowParserError
              ((ScriptContext *)funcBody,HStack_38,
               (CompileScriptException *)&__leaveScriptObject.__exceptionCheck);
  }
  if (-1 < (int)local_58) {
    if (local_68 == (ParseableFunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                  ,0x3af,"(funcBody != nullptr)","funcBody != nullptr");
      if (!bVar4) {
LAB_00a245f2:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    ParseableFunctionInfo::SetDisplayName(local_68,pszTitle);
    pPVar13 = funcBody;
    puVar1 = &(local_68->super_FunctionProxy).field_0x44;
    *puVar1 = *puVar1 | 2;
    if ((local_3c >> 0x11 & 1) == 0) {
      local_c58 = (undefined1  [8])0x0;
      BVar8 = JavascriptStackWalker::GetCaller
                        ((JavascriptFunction **)local_c58,(ScriptContext *)funcBody);
      if ((local_c58 != (undefined1  [8])0x0 && BVar8 != 0) &&
         (BVar8 = JavascriptFunction::IsScriptFunction((JavascriptFunction *)local_c58), BVar8 != 0)
         ) {
        pFVar10 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_c58);
        Utf8SourceInfo::SetCallerUtf8SourceInfo
                  ((local_68->super_FunctionProxy).m_utf8SourceInfo.ptr,
                   (pFVar10->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr);
      }
    }
    if (registerDocument != 0) {
      ParseableFunctionInfo::RegisterFuncToDiag(local_68,(ScriptContext *)pPVar13,pszTitle);
      local_68 = FunctionProxy::GetParseableFunctionInfo(&local_68->super_FunctionProxy);
      pPVar13 = funcBody;
    }
    bVar4 = FunctionProxy::IsCoroutine(&local_68->super_FunctionProxy);
    this_00 = (JavascriptLibrary *)(pPVar13->super_FunctionProxy).auxPtrs.ptr;
    if (bVar4) {
      pGVar11 = JavascriptLibrary::CreateGeneratorVirtualScriptFunction
                          (this_00,&local_68->super_FunctionProxy);
    }
    else {
      pGVar11 = (GeneratorVirtualScriptFunction *)
                JavascriptLibrary::CreateScriptFunction(this_00,&local_68->super_FunctionProxy);
    }
    CompileScriptException::~CompileScriptException
              ((CompileScriptException *)&__leaveScriptObject.__exceptionCheck);
    return &pGVar11->super_ScriptFunction;
  }
  if ((int)local_58 != -0x7999bffc) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x394,"(hrCodeGen == ((HRESULT)0x86664004L))",
                                "hrCodeGen == SCRIPT_E_RECORDED");
    if (!bVar4) goto LAB_00a245f2;
    *puVar9 = 0;
  }
  CompileScriptException::Free((CompileScriptException *)&__leaveScriptObject.__exceptionCheck);
  JavascriptError::MapAndThrowError((ScriptContext *)funcBody,0);
}

Assistant:

ScriptFunction* GlobalObject::DefaultEvalHelper(ScriptContext* scriptContext, const char16 *source, int sourceLength, ModuleID moduleID, uint32 grfscr, LPCOLESTR pszTitle, BOOL registerDocument, BOOL isIndirect, BOOL strictMode)
    {
        Assert(sourceLength >= 0);
        AnalysisAssert(scriptContext);
        if (scriptContext->GetThreadContext()->EvalDisabled())
        {
            throw Js::EvalDisabledException();
        }

#ifdef PROFILE_EXEC
        scriptContext->ProfileBegin(Js::EvalCompilePhase);
#endif
        void * frameAddr = nullptr;
        GET_CURRENT_FRAME_ID(frameAddr);

        HRESULT hr = S_OK;
        HRESULT hrParser = S_OK;
        HRESULT hrCodeGen = S_OK;
        CompileScriptException se;
        Js::ParseableFunctionInfo * funcBody = NULL;
        uint sourceIndex = Constants::InvalidSourceIndex;
        BEGIN_LEAVE_SCRIPT_INTERNAL(scriptContext);
        BEGIN_TRANSLATE_EXCEPTION_TO_HRESULT
        {
            uint cchSource = sourceLength;
            size_t cbUtf8Buffer = UInt32Math::MulAdd<3, 1>(cchSource);

            ArenaAllocator tempArena(_u("EvalHelperArena"), scriptContext->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory);
            LPUTF8 utf8Source = AnewArray(&tempArena, utf8char_t, cbUtf8Buffer);

            Assert(cchSource < MAXLONG);
            size_t cbSource = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8Source, cbUtf8Buffer, source, static_cast<charcount_t>(cchSource));
            Assert(cbSource + 1 <= cbUtf8Buffer);

            SRCINFO const * pSrcInfo = scriptContext->GetModuleSrcInfo(moduleID);
            // Source Info objects are kept alive by the function bodies that are referencing it
            // The function body is created in GenerateByteCode but the source info isn't passed in, only the index
            // So we need to pin it here (TODO: Change GenerateByteCode to take in the sourceInfo itself)
            ENTER_PINNED_SCOPE(Utf8SourceInfo, sourceInfo);
            sourceInfo = Utf8SourceInfo::New(scriptContext, utf8Source, cchSource,
              cbSource, pSrcInfo, ((grfscr & fscrIsLibraryCode) != 0));

            Parser parser(scriptContext, strictMode);
            bool forceNoNative = false;

            ParseNodeProg * parseTree = nullptr;

            SourceContextInfo * sourceContextInfo = pSrcInfo->sourceContextInfo;
            ULONG deferParseThreshold = Parser::GetDeferralThreshold(sourceContextInfo->IsSourceProfileLoaded());
            if ((ULONG)sourceLength > deferParseThreshold && !PHASE_OFF1(Phase::DeferParsePhase))
            {
                // Defer function bodies declared inside large dynamic blocks.
                grfscr |= fscrWillDeferFncParse;
            }

            grfscr = grfscr | fscrDynamicCode;

            // fscrEval signifies direct eval in parser
            hrParser = parser.ParseCesu8Source(&parseTree, utf8Source, cbSource, isIndirect ? grfscr & ~fscrEval : grfscr, &se, &sourceContextInfo->nextLocalFunctionId,
                sourceContextInfo);
            sourceInfo->SetParseFlags(grfscr);

            if (SUCCEEDED(hrParser) && parseTree)
            {
                // This keeps function bodies generated by the byte code alive till we return
                Js::AutoDynamicCodeReference dynamicFunctionReference(scriptContext);

                Assert(cchSource < MAXLONG);
                sourceIndex = scriptContext->SaveSourceNoCopy(sourceInfo, cchSource, true);

                // Tell byte code gen not to attempt to interact with the caller's context if this is indirect eval.
                // TODO: Handle strict mode.
                if (isIndirect &&
                    !strictMode &&
                    !parseTree->GetStrictMode())
                {
                    grfscr &= ~fscrEval;
                }
                hrCodeGen = GenerateByteCode(parseTree, grfscr, scriptContext, &funcBody, sourceIndex, forceNoNative, &parser, &se);
                sourceInfo->SetByteCodeGenerationFlags(grfscr);
            }

            LEAVE_PINNED_SCOPE();
        }